

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::fillMetaData(int fd,QFileSystemMetaData *data)

{
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> mask;
  int iVar1;
  QFileSystemMetaData *in_RSI;
  Int in_EDI;
  long in_FS_OFFSET;
  int ret;
  anon_class_16_2_514eab85 getSizeForBlockDev;
  stat64 statBuffer;
  statx statxBuffer;
  undefined4 in_stack_fffffffffffffe28;
  mode_t in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  enum_type in_stack_fffffffffffffe34;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  bool bVar2;
  QFileSystemMetaData *this;
  undefined1 local_19c [148];
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QFileSystemMetaData *)local_19c;
  local_19c._0_4_ = in_EDI;
  mask.i = (Int)operator~(in_stack_fffffffffffffe34);
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator&=
            (&in_RSI->entryFlags,(QFlags<QFileSystemMetaData::MetaDataFlag>)mask.i);
  QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(&in_RSI->knownFlagsMask,PosixStatFlags);
  memset(local_108,0xaa,0x100);
  iVar1 = qt_fstatx(in_stack_fffffffffffffe34,
                    (statx *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (iVar1 == -0x26) {
    memset(local_19c + 4,0xaa,0x90);
    iVar1 = fstat64(local_19c._0_4_,(stat64 *)(local_19c + 4));
    if (iVar1 == 0) {
      QFileSystemMetaData::fillFromStatBuf
                (this,(stat64 *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
      fillMetaData::anon_class_16_2_514eab85::operator()
                ((anon_class_16_2_514eab85 *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe2c);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  else if (iVar1 == 0) {
    QFileSystemMetaData::fillFromStatxBuf(in_RSI,(statx *)((ulong)mask.i << 0x20));
    fillMetaData::anon_class_16_2_514eab85::operator()
              ((anon_class_16_2_514eab85 *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::fillMetaData(int fd, QFileSystemMetaData &data)
{
    auto getSizeForBlockDev = [&](mode_t st_mode) {
#ifdef BLKGETSIZE64
        // Linux
        if (quint64 sz; (st_mode & S_IFMT) == S_IFBLK && ioctl(fd, BLKGETSIZE64, &sz) == 0)
            data.size_ = sz;        // returns byte count
#elif defined(BLKGETSIZE)
        // older Linux
        if (ulong sz; (st_mode & S_IFMT) == S_IFBLK && ioctl(fd, BLKGETSIZE, &sz) == 0)
            data.size_ = sz * 512;  // returns 512-byte sector count
#elif defined(DKIOCGETBLOCKCOUNT)
        // Apple Darwin
        qint32 blksz;
        if (quint64 count; (st_mode & S_IFMT) == S_IFBLK
                && ioctl(fd, DKIOCGETBLOCKCOUNT, &count) == 0
                && ioctl(fd, DKIOCGETBLOCKSIZE, &blksz) == 0)
            data.size_ = count * blksz;
#elif defined(DIOCGMEDIASIZE)
        // FreeBSD
        // see Linux-compat implementation in
        // http://fxr.watson.org/fxr/source/compat/linux/linux_ioctl.c?v=FREEBSD-13-STABLE#L282
        // S_IFCHR is correct: FreeBSD doesn't have block devices any more
        if (QT_OFF_T sz; (st_mode & S_IFMT) == S_IFCHR && ioctl(fd, DIOCGMEDIASIZE, &sz) == 0)
            data.size_ = sz;        // returns byte count
#else
        Q_UNUSED(st_mode);
#endif
    };
    data.entryFlags &= ~QFileSystemMetaData::PosixStatFlags;
    data.knownFlagsMask |= QFileSystemMetaData::PosixStatFlags;

    struct statx statxBuffer;

    int ret = qt_fstatx(fd, &statxBuffer);
    if (ret != -ENOSYS) {
        if (ret == 0) {
            data.fillFromStatxBuf(statxBuffer);
            getSizeForBlockDev(statxBuffer.stx_mode);
            return true;
        }
        return false;
    }

    QT_STATBUF statBuffer;

    if (QT_FSTAT(fd, &statBuffer) == 0) {
        data.fillFromStatBuf(statBuffer);
        getSizeForBlockDev(statBuffer.st_mode);
        return true;
    }

    return false;
}